

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::MergeReturnPass::BreakFromConstruct
          (MergeReturnPass *this,BasicBlock *block,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *predicated,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order,
          Instruction *break_merge_inst)

{
  iterator iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t false_id;
  uint32_t merge_id;
  Instruction *pIVar4;
  CFG *pCVar5;
  BasicBlock *pBVar6;
  size_type sVar7;
  TypeManager *this_00;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var8;
  IRContext *this_01;
  IRContext *this_02;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar9;
  initializer_list<unsigned_int> init_list;
  BasicBlock *old_body;
  BasicBlock *merge_block;
  uint32_t local_90;
  uint32_t old_body_id;
  Instruction *local_88;
  iterator local_80;
  Bool bool_type;
  InstructionBuilder builder;
  
  IRContext::InvalidateAnalyses((this->super_MemPass).super_Pass.context_,kAnalysisCFG);
  IRContext::BuildInvalidAnalyses((this->super_MemPass).super_Pass.context_,kAnalysisCFG);
  pIVar4 = BasicBlock::GetLoopMergeInst(block);
  if (pIVar4 != (Instruction *)0x0) {
    pCVar5 = Pass::cfg((Pass *)this);
    pBVar6 = CFG::SplitLoopHeader(pCVar5,block);
    if (pBVar6 == (BasicBlock *)0x0) {
      return false;
    }
  }
  local_88 = break_merge_inst;
  uVar2 = Instruction::GetSingleWordInOperand(break_merge_inst,0);
  pBVar6 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,uVar2);
  merge_block = pBVar6;
  pIVar4 = BasicBlock::GetLoopMergeInst(pBVar6);
  if (pIVar4 != (Instruction *)0x0) {
    pCVar5 = Pass::cfg((Pass *)this);
    CFG::SplitLoopHeader(pCVar5,pBVar6);
  }
  iVar1.node_ = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  do {
    iVar1.node_ = *(Instruction **)
                   ((long)&(iVar1.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
  } while ((iVar1.node_)->opcode_ == OpPhi);
  pCVar5 = Pass::cfg((Pass *)this);
  CFG::RemoveSuccessorEdges(pCVar5,block);
  old_body_id = Pass::TakeNextId((Pass *)this);
  local_80.super_iterator.node_ = (iterator)(iterator)iVar1.node_;
  old_body = BasicBlock::SplitBasicBlock
                       (block,(this->super_MemPass).super_Pass.context_,old_body_id,&local_80);
  std::__detail::
  _Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)predicated,&old_body);
  this_02 = (IRContext *)&this->return_blocks_;
  uVar2 = BasicBlock::id(block);
  bool_type.super_Type._vptr_Type =
       (_func_int **)CONCAT44(bool_type.super_Type._vptr_Type._4_4_,uVar2);
  this_01 = this_02;
  sVar7 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)this_02,(key_type_conflict *)&bool_type);
  if (sVar7 != 0) {
    std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)this_02,&old_body_id);
    this_01 = this_02;
  }
  pIVar4 = local_88;
  if (local_88->opcode_ == OpLoopMerge) {
    uVar2 = Instruction::GetSingleWordInOperand(local_88,1);
    this_01 = (IRContext *)block;
    uVar3 = BasicBlock::id(block);
    if (uVar2 == uVar3) {
      builder.context_._0_4_ = BasicBlock::id(old_body);
      init_list._M_len = 1;
      init_list._M_array = (iterator)&builder;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&bool_type,init_list);
      Instruction::SetInOperand(pIVar4,1,(SmallVector<unsigned_int,_2UL> *)&bool_type);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&bool_type);
      this_01 = (this->super_MemPass).super_Pass.context_;
      IRContext::UpdateDefUse(this_01,pIVar4);
    }
  }
  InsertAfterElement((MergeReturnPass *)this_01,block,old_body,order);
  InstructionBuilder::InstructionBuilder
            (&builder,(this->super_MemPass).super_Pass.context_,block,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  bool_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bool_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bool_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bool_type.super_Type.kind_ = kBool;
  bool_type.super_Type._vptr_Type = (_func_int **)&PTR__Type_003aed10;
  this_00 = IRContext::get_type_mgr((this->super_MemPass).super_Pass.context_);
  uVar2 = analysis::TypeManager::GetId(this_00,&bool_type.super_Type);
  if (uVar2 != 0) {
    uVar3 = Instruction::result_id(this->return_flag_);
    pIVar4 = InstructionBuilder::AddLoad(&builder,uVar2,uVar3,0);
    uVar2 = Instruction::result_id(pIVar4);
    uVar3 = BasicBlock::id(pBVar6);
    false_id = BasicBlock::id(old_body);
    merge_id = BasicBlock::id(old_body);
    InstructionBuilder::AddConditionalBranch(&builder,uVar2,uVar3,false_id,merge_id,0);
    p_Var8 = &std::__detail::
              _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->new_edges_,&merge_block)->_M_t;
    local_90 = BasicBlock::id(block);
    pVar9 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_insert_unique<unsigned_int>(p_Var8,&local_90);
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      p_Var8 = &std::__detail::
                _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->new_edges_,&merge_block)->_M_t;
      local_90 = BasicBlock::id(old_body);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_insert_unique<unsigned_int>(p_Var8,&local_90);
    }
    UpdatePhiNodes(this,block,merge_block);
    pCVar5 = Pass::cfg((Pass *)this);
    CFG::AddEdges(pCVar5,block);
    pCVar5 = Pass::cfg((Pass *)this);
    CFG::RegisterBlock(pCVar5,old_body);
    if ((old_body->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ !=
        &(old_body->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      if ((block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
          super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ !=
          &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
        analysis::Type::~Type(&bool_type.super_Type);
        return true;
      }
      __assert_fail("block->begin() != block->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x216,
                    "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
                   );
    }
    __assert_fail("old_body->begin() != old_body->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0x215,
                  "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
                 );
  }
  __assert_fail("bool_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                ,0x1fe,
                "bool spvtools::opt::MergeReturnPass::BreakFromConstruct(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *, Instruction *)"
               );
}

Assistant:

bool MergeReturnPass::BreakFromConstruct(
    BasicBlock* block, std::unordered_set<BasicBlock*>* predicated,
    std::list<BasicBlock*>* order, Instruction* break_merge_inst) {
  // Make sure the CFG is build here.  If we don't then it becomes very hard
  // to know which new blocks need to be updated.
  context()->InvalidateAnalyses(IRContext::kAnalysisCFG);
  context()->BuildInvalidAnalyses(IRContext::kAnalysisCFG);

  // When predicating, be aware of whether this block is a header block, a
  // merge block or both.
  //
  // If this block is a merge block, ensure the appropriate header stays
  // up-to-date with any changes (i.e. points to the pre-header).
  //
  // If this block is a header block, predicate the entire structured
  // subgraph. This can act recursively.

  // If |block| is a loop header, then the back edge must jump to the original
  // code, not the new header.
  if (block->GetLoopMergeInst()) {
    if (cfg()->SplitLoopHeader(block) == nullptr) {
      return false;
    }
  }

  uint32_t merge_block_id = break_merge_inst->GetSingleWordInOperand(0);
  BasicBlock* merge_block = context()->get_instr_block(merge_block_id);
  if (merge_block->GetLoopMergeInst()) {
    cfg()->SplitLoopHeader(merge_block);
  }

  // Leave the phi instructions behind.
  auto iter = block->begin();
  while (iter->opcode() == spv::Op::OpPhi) {
    ++iter;
  }

  // Forget about the edges leaving block.  They will be removed.
  cfg()->RemoveSuccessorEdges(block);

  auto old_body_id = TakeNextId();
  BasicBlock* old_body = block->SplitBasicBlock(context(), old_body_id, iter);
  predicated->insert(old_body);

  // If a return block is being split, mark the new body block also as a return
  // block.
  if (return_blocks_.count(block->id())) {
    return_blocks_.insert(old_body_id);
  }

  // If |block| was a continue target for a loop |old_body| is now the correct
  // continue target.
  if (break_merge_inst->opcode() == spv::Op::OpLoopMerge &&
      break_merge_inst->GetSingleWordInOperand(1) == block->id()) {
    break_merge_inst->SetInOperand(1, {old_body->id()});
    context()->UpdateDefUse(break_merge_inst);
  }

  // Update |order| so old_block will be traversed.
  InsertAfterElement(block, old_body, order);

  // Within the new header we need the following:
  // 1. Load of the return status flag
  // 2. Branch to |merge_block| (true) or old body (false)
  // 3. Update OpPhi instructions in |merge_block|.
  // 4. Update the CFG.
  //
  // Since we are branching to the merge block of the current construct, there
  // is no need for an OpSelectionMerge.

  InstructionBuilder builder(
      context(), block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  // 1. Load of the return status flag
  analysis::Bool bool_type;
  uint32_t bool_id = context()->get_type_mgr()->GetId(&bool_type);
  assert(bool_id != 0);
  uint32_t load_id =
      builder.AddLoad(bool_id, return_flag_->result_id())->result_id();

  // 2. Branch to |merge_block| (true) or |old_body| (false)
  builder.AddConditionalBranch(load_id, merge_block->id(), old_body->id(),
                               old_body->id());

  if (!new_edges_[merge_block].insert(block->id()).second) {
    // It is possible that we already inserted a new edge to the merge block.
    // If so, that edge now goes from |old_body| to |merge_block|.
    new_edges_[merge_block].insert(old_body->id());
  }

  // 3. Update OpPhi instructions in |merge_block|.
  UpdatePhiNodes(block, merge_block);

  // 4. Update the CFG.  We do this after updating the OpPhi instructions
  // because |UpdatePhiNodes| assumes the edge from |block| has not been added
  // to the CFG yet.
  cfg()->AddEdges(block);
  cfg()->RegisterBlock(old_body);

  assert(old_body->begin() != old_body->end());
  assert(block->begin() != block->end());
  return true;
}